

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

int UTF_uj32_cmpn(UTF_UC32 *uj32a,UTF_UC32 *uj32b,size_t len)

{
  bool bVar1;
  size_t local_28;
  size_t len_local;
  UTF_UC32 *uj32b_local;
  UTF_UC32 *uj32a_local;
  
  local_28 = len;
  len_local = (size_t)uj32b;
  uj32b_local = uj32a;
  while( true ) {
    bVar1 = false;
    if (*uj32b_local != L'\0') {
      bVar1 = *(int *)len_local != 0;
    }
    if (!bVar1) {
      if ((uint)*uj32b_local < (uint)*(UTF_UC32 *)len_local) {
        return -1;
      }
      if ((uint)*(UTF_UC32 *)len_local < (uint)*uj32b_local) {
        return 1;
      }
      return 0;
    }
    if (local_28 == 0) {
      return 0;
    }
    if ((uint)*uj32b_local < (uint)*(UTF_UC32 *)len_local) break;
    if ((uint)*(UTF_UC32 *)len_local < (uint)*uj32b_local) {
      return 1;
    }
    uj32b_local = uj32b_local + 1;
    len_local = len_local + 4;
    local_28 = local_28 - 1;
  }
  return -1;
}

Assistant:

static __inline int
UTF_uj32_cmpn(const UTF_UC32 *uj32a, const UTF_UC32 *uj32b, UTF_SIZE_T len)
{
    while (*uj32a && *uj32b)
    {
        if (len-- == 0) return 0;
        if (*uj32a < *uj32b) return -1;
        if (*uj32a > *uj32b) return 1;
        ++uj32a;
        ++uj32b;
    }
    if (*uj32a < *uj32b) return -1;
    if (*uj32a > *uj32b) return 1;
    return 0;
}